

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_factory.cxx
# Opt level: O1

xr_clsid * __thiscall xr_entity_factory::get_entity_clsid(xr_entity_factory *this,char *name)

{
  pointer ppfVar1;
  ulong uVar2;
  bool bVar3;
  xr_ini_file *this_00;
  uint64_t uVar4;
  pointer ppfVar5;
  ulong uVar6;
  xr_clsid clsid;
  xr_clsid local_20;
  
  if (this->m_system_ini == (xr_ini_file *)0x0) {
    this_00 = (xr_ini_file *)operator_new(0x18);
    (this_00->m_sections).
    super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->m_sections).
    super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->m_sections).
    super__Vector_base<xray_re::xr_ini_file::ini_section_*,_std::allocator<xray_re::xr_ini_file::ini_section_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    xray_re::xr_ini_file::load(this_00,"$game_config$","system.ltx");
    this->m_system_ini = this_00;
  }
  bVar3 = xray_re::xr_ini_file::section_exist(this->m_system_ini,name);
  if (bVar3) {
    uVar4 = xray_re::xr_ini_file::r_clsid(this->m_system_ini,name,"class");
    ppfVar5 = (this->m_clsids).
              super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppfVar1 = (this->m_clsids).
              super__Vector_base<factory_item_base_*,_std::allocator<factory_item_base_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar6 = (long)ppfVar1 - (long)ppfVar5 >> 3;
    while (uVar2 = uVar6, 0 < (long)uVar2) {
      uVar6 = uVar2 >> 1;
      if ((ppfVar5[uVar6]->m_clsid).field_0.quad < uVar4) {
        ppfVar5 = ppfVar5 + uVar6 + 1;
        uVar6 = ~uVar6 + uVar2;
      }
    }
    if ((ppfVar5 != ppfVar1) && (((*ppfVar5)->m_clsid).field_0.quad == uVar4)) {
      return &local_20;
    }
  }
  return (xr_clsid *)0x0;
}

Assistant:

xr_clsid* xr_entity_factory::get_entity_clsid(const char* name)
{
	if (m_system_ini == 0)
		m_system_ini = new xr_ini_file(PA_GAME_CONFIG, "system.ltx");
  
	if (m_system_ini->section_exist(name)) {
		xr_clsid clsid(m_system_ini->r_clsid(name, "class"));
		std::vector<factory_item_base*>::iterator it = lower_bound_if(
				m_clsids.begin(), m_clsids.end(), clsid_pred2(clsid));
		if (it != m_clsids.end() && (*it)->clsid() == clsid)
		{
			xr_clsid* temp = &clsid;
			return temp;
		}
	}

	return NULL;
}